

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O3

void __thiscall
agge::layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
          (layout *this,long *text,undefined8 *param_3)

{
  positioned_glyph *ppVar1;
  long *plVar2;
  byte *pbVar3;
  float fVar4;
  byte bVar5;
  positioned_glyph *ppVar6;
  long lVar7;
  long lVar8;
  pointer ptVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  positioned_glyph *ppVar13;
  long *plVar14;
  long lVar15;
  glyph *pgVar16;
  pointer ptVar17;
  uint uVar18;
  positioned_glyph *ppVar20;
  long lVar21;
  pointer ptVar22;
  ulong uVar23;
  uint uVar24;
  positioned_glyph *ppVar25;
  ulong uVar26;
  byte *pbVar27;
  byte *pbVar28;
  float fVar29;
  ptr font_;
  layout_builder builder;
  shared_ptr<agge::font> local_78;
  layout_builder local_68;
  int iVar19;
  
  uVar23 = text[1];
  uVar24 = (uint)uVar23;
  ppVar25 = (this->_glyphs)._begin;
  iVar19 = (int)((ulong)((long)(this->_glyphs)._limit - (long)ppVar25) >> 2);
  uVar18 = iVar19 * -0x55555555;
  uVar12 = uVar24 + iVar19 * 0x55555555;
  if (uVar18 <= uVar24 && uVar12 != 0) {
    ppVar6 = (this->_glyphs)._end;
    uVar24 = uVar18 >> 1;
    if (uVar18 < uVar12 * 2) {
      uVar24 = uVar12;
    }
    uVar26 = (ulong)(uVar24 + uVar18 + (uint)(uVar24 == 0));
    ppVar13 = (positioned_glyph *)operator_new__(uVar26 * 0xc);
    ppVar20 = ppVar13;
    for (ppVar1 = ppVar25; ppVar1 != ppVar6; ppVar1 = ppVar1 + 1) {
      (ppVar20->d).dy = (ppVar1->d).dy;
      fVar29 = (ppVar1->d).dx;
      ppVar20->index = ppVar1->index;
      (ppVar20->d).dx = fVar29;
      ppVar20 = ppVar20 + 1;
    }
    if (ppVar25 != (positioned_glyph *)0x0) {
      operator_delete__(ppVar25);
    }
    (this->_glyphs)._begin = ppVar13;
    (this->_glyphs)._limit = ppVar13 + uVar26;
    ppVar25 = ppVar13;
  }
  plVar2 = text + 1;
  (this->_glyphs)._end = ppVar25 + (uVar23 & 0xffffffff);
  (this->_box).w = 0.0;
  (this->_box).h = 0.0;
  layout_builder::layout_builder(&local_68,&this->_glyphs,&this->_glyph_runs,&this->_text_lines);
  lVar7 = text[4];
  lVar8 = text[5];
  if (lVar8 == lVar7) {
    lVar21 = *plVar2;
    lVar11 = lVar21;
    lVar10 = lVar7;
    lVar15 = lVar21;
  }
  else {
    plVar14 = (long *)(lVar7 + 0x68);
    if (lVar7 + 0x38 == lVar8) {
      plVar14 = plVar2;
    }
    lVar21 = *plVar2;
    lVar11 = *plVar14;
    lVar10 = lVar7 + 0x38;
    lVar15 = 0;
  }
  do {
    if ((lVar15 == lVar21) && (lVar11 == lVar21)) {
      layout_builder::break_current_line(&local_68);
      ptVar9 = (this->_text_lines).
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_start;
      ptVar22 = (this->_text_lines).
                super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
      (this->_text_lines).super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
      _M_impl.super__Vector_impl_data._M_finish = ptVar22;
      if (ptVar9 != ptVar22) {
        fVar29 = (this->_box).w;
        do {
          ptVar17 = ptVar9;
          fVar4 = ptVar17->extent;
          if (fVar29 < fVar4) {
            (this->_box).w = fVar4;
            fVar29 = fVar4;
          }
          ptVar9 = ptVar17 + 1;
        } while (ptVar17 + 1 != ptVar22);
        (this->_box).h = (ptVar17->offset).dy + ptVar17->descent;
      }
      return;
    }
    (**(code **)*param_3)(&local_78,param_3,lVar7);
    layout_builder::begin_style(&local_68,&local_78);
    if (lVar15 != lVar11) {
      pbVar3 = (byte *)(*text + lVar11);
      pbVar27 = (byte *)(lVar15 + *text);
      do {
        bVar5 = *pbVar27;
        uVar24 = (uint)bVar5;
        if (bVar5 == 10) {
          layout_builder::break_current_line(&local_68);
          pbVar27 = pbVar27 + 1;
        }
        else {
          pbVar28 = pbVar27 + 1;
          pbVar27 = pbVar28;
          if ((char)bVar5 < '\0') {
            if (bVar5 < 0xc0) {
LAB_0014f4db:
              uVar24 = 0xfffd;
              pbVar27 = pbVar28;
            }
            else {
              if (bVar5 < 0xe0) {
                lVar15 = 1;
                uVar24 = 0x1f;
              }
              else if (bVar5 < 0xf0) {
                lVar15 = 2;
                uVar24 = 0xf;
              }
              else {
                if (0xf7 < bVar5) goto LAB_0014f4db;
                lVar15 = 3;
                uVar24 = 7;
              }
              if (lVar15 <= (long)pbVar3 - (long)pbVar28) {
                uVar24 = bVar5 & uVar24;
                pbVar27 = pbVar28 + lVar15;
                do {
                  if ((*pbVar28 & 0xffffffc0) != 0x80) goto LAB_0014f4db;
                  uVar24 = *pbVar28 & 0x3f | uVar24 << 6;
                  pbVar28 = pbVar28 + 1;
                  lVar15 = lVar15 + -1;
                } while (lVar15 != 0);
                goto LAB_0014f4c3;
              }
              uVar24 = 0xfffd;
              pbVar27 = pbVar3;
            }
LAB_0014f529:
            pgVar16 = font::get_glyph_for_codepoint_slow
                                (local_78.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,uVar24);
          }
          else {
LAB_0014f4c3:
            if ((0x7f < uVar24) ||
               (pgVar16 = (local_78.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->_ansi_glyphs[uVar24], pgVar16 == (glyph *)0x0))
            goto LAB_0014f529;
          }
          fVar29 = (pgVar16->metrics).advance_x;
          uVar23 = (ulong)local_68._state.next;
          local_68._state.next = local_68._state.next + 1;
          ppVar25 = (local_68._glyphs)->_begin;
          ppVar25[uVar23].index = pgVar16->index;
          ppVar25[uVar23].d.dx = fVar29;
          ppVar25[uVar23].d.dy = 0.0;
          local_68._state.extent = fVar29 + local_68._state.extent;
        }
      } while (pbVar27 != pbVar3);
    }
    if (local_78.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    lVar15 = lVar11;
    if (lVar8 != lVar10) {
      plVar14 = (long *)(lVar10 + 0x68);
      if (lVar8 == lVar10 + 0x38) {
        plVar14 = plVar2;
      }
      lVar7 = lVar10;
      lVar11 = *plVar14;
      lVar10 = lVar10 + 0x38;
    }
  } while( true );
}

Assistant:

inline void layout::process(const richtext_t &text, LimiterT limiter, FontFactoryT &font_factory_)
	{
		_glyphs.resize(static_cast<count_t>(text.size()));
		_box = zero();

		layout_builder builder(_glyphs, _glyph_runs, _text_lines);

		for (richtext_t::const_iterator range = text.ranges_begin(), ranges_end = text.ranges_end(); range != ranges_end;
			++range)
		{
			const font::ptr font_ = font_factory_.create_font(range->get_annotation().basic);

			builder.begin_style(font_);
			limiter.begin_style(static_cast<const layout_builder &>(builder));
			for (std::string::const_iterator i = range->begin(), end = range->end(); i != end; )
			{
				if (eat_lf(i))
				{
					builder.break_current_line();
					limiter.new_line();
					continue;
				}

				std::string::const_iterator next = i;
				const glyph &g = *font_->get_glyph_for_codepoint(utfia::utf8::next(next, end));

				if (!limiter.add_glyph(builder, g.index, g.metrics.advance_x, i, next, end))
				{
					_text_lines.clear();
					return;
				}
			}
		}
		builder.break_current_line();
		_text_lines.pop_back();
		for (text_lines_container_t::const_iterator i = _text_lines.begin(); i != _text_lines.end(); ++i)
		{
			if (i->extent > _box.w)
				_box.w = i->extent;
			_box.h = i->offset.dy + i->descent;
		}
	}